

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O2

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *__lhs;
  cmCTest *pcVar1;
  pointer pbVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  long lVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char **ppcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string filename;
  string finalpath;
  string FoundSource;
  string line;
  ifstream fin;
  byte abStack_218 [488];
  
  FoundSource._M_dataplus._M_p = (pointer)&FoundSource.field_2;
  FoundSource._M_string_length = 0;
  FoundSource.field_2._M_local_buf[0] = '\0';
  finalpath._M_dataplus._M_p = (pointer)&finalpath.field_2;
  finalpath._M_string_length = 0;
  finalpath.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(name,"source");
  if (bVar3) {
    this->InSource = true;
    goto LAB_00305853;
  }
  bVar3 = std::operator==(name,"sources");
  if (bVar3) {
    this->InSources = true;
    goto LAB_00305853;
  }
  bVar3 = std::operator==(name,"class");
  if (!bVar3) {
    bVar3 = std::operator==(name,"line");
    if ((bVar3) && (this->SkipThisClass == false)) {
      ppcVar13 = atts + 1;
      uVar6 = 0xffffffff;
      iVar4 = -1;
      do {
        __s1 = ppcVar13[-1];
        iVar5 = strcmp(__s1,"hits");
        if (iVar5 == 0) {
          iVar4 = atoi(*ppcVar13);
        }
        else {
          iVar5 = strcmp(__s1,"number");
          if (iVar5 == 0) {
            uVar6 = atoi(*ppcVar13);
          }
        }
        ppcVar13 = ppcVar13 + 1;
      } while ((int)uVar6 < 1 || iVar4 < 0);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
      (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(ulong)uVar6 - 1] = iVar4;
    }
    goto LAB_00305853;
  }
  do {
    iVar4 = strcmp(*atts,"filename");
    atts = atts + 1;
  } while (iVar4 != 0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
  poVar7 = std::operator<<((ostream *)&fin,"Reading file: ");
  poVar7 = std::operator<<(poVar7,*atts);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x45,line._M_dataplus._M_p,this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
  std::__cxx11::string::string((string *)&filename,*atts,(allocator *)&fin);
  __lhs = &this->CurFileName;
  std::__cxx11::string::assign((char *)__lhs);
  uVar11 = 0xffffffffffffffff;
  lVar12 = 0;
  do {
    pbVar2 = (this->FilePaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = uVar11 + 1;
    if ((ulong)((long)(this->FilePaths).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar11)
    goto LAB_00305523;
    uVar10 = (long)&(pbVar2->_M_dataplus)._M_p + lVar12;
    lVar12 = lVar12 + 0x20;
    lVar8 = std::__cxx11::string::find((string *)&filename,uVar10);
  } while (lVar8 != 0);
  std::__cxx11::string::_M_assign((string *)__lhs);
LAB_00305523:
  bVar3 = std::operator==(__lhs,"");
  if (bVar3) {
    uVar11 = 0xffffffffffffffff;
    lVar12 = 0;
    do {
      pbVar2 = (this->FilePaths).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar11 + 1;
      if ((ulong)((long)(this->FilePaths).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar11)
      goto LAB_003055cb;
      std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(pbVar2->_M_dataplus)._M_p + lVar12),"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,&line
                     ,&filename);
      std::__cxx11::string::operator=((string *)&finalpath,(string *)&fin);
      std::__cxx11::string::~string((string *)&fin);
      std::__cxx11::string::~string((string *)&line);
      bVar3 = cmsys::SystemTools::FileExists(finalpath._M_dataplus._M_p);
      lVar12 = lVar12 + 0x20;
    } while (!bVar3);
    std::__cxx11::string::_M_assign((string *)__lhs);
  }
LAB_003055cb:
  std::ifstream::ifstream(&fin,(__lhs->_M_dataplus)._M_p,_S_in);
  bVar3 = std::operator==(__lhs,"");
  if ((bVar3) || ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0)) {
    std::operator+(&local_430,&this->Coverage->BinaryDir,"/");
    std::operator+(&line,&local_430,*atts);
    std::__cxx11::string::operator=((string *)__lhs,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_430);
    std::ifstream::open((char *)&fin,(_Ios_Openmode)(__lhs->_M_dataplus)._M_p);
    if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) goto LAB_003057c9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
    poVar7 = std::operator<<((ostream *)&line,"Skipping system file ");
    poVar7 = std::operator<<(poVar7,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x67,(char *)CONCAT44(local_430._M_dataplus._M_p._4_4_,
                                        local_430._M_dataplus._M_p._0_4_),this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
    this->SkipThisClass = true;
  }
  else {
LAB_003057c9:
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->Coverage->TotalCoverage,__lhs);
    while (bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1),
          bVar3) {
      local_430._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar9,(int *)&local_430);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&filename);
LAB_00305853:
  std::__cxx11::string::~string((string *)&finalpath);
  std::__cxx11::string::~string((string *)&FoundSource);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) CM_OVERRIDE
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName = "";

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (size_t i = 0; i < FilePaths.size(); i++) {
            if (filename.find(FilePaths[i]) == 0) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName == "") {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (size_t i = 0; i < FilePaths.size(); i++) {
              finalpath = FilePaths[i] + "/" + filename;
              if (cmSystemTools::FileExists(finalpath.c_str())) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName == "" || !fin) {
            this->CurFileName =
              this->Coverage.BinaryDir + "/" + atts[tagCount + 1];
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }